

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O1

void CsvParamsIntTest::TearDownTestCase(void)

{
  int *in_R9;
  int *expected;
  long *plVar1;
  AssertionResult iutest_ar;
  allocator<char> local_211;
  AssertionResult local_210;
  long *local_1e8 [2];
  long local_1d8 [2];
  char *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8 [32];
  ios_base local_138 [264];
  
  expected = check_params;
  plVar1 = (long *)0x0;
  do {
    local_1b8[0] = 0;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_210,(internal *)0x133286,"check_params[i]",(char *)local_1b8,expected,in_R9);
    if (local_210.m_result == false) {
      memset((stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      local_1e8[0] = plVar1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1b8,(unsigned_long *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
      ;
      local_1c0 = 0x10000002d;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1e8,(Fixed *)local_1b8,false);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    plVar1 = (long *)((long)plVar1 + 1);
    expected = expected + 1;
  } while (plVar1 != (long *)0x7);
  return;
}

Assistant:

static void TearDownTestCase(void)
    {
        for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
        {
            IUTEST_EXPECT_EQ( 0, check_params[i] ) << i;
        }
    }